

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::InternalSwap
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *other)

{
  intptr_t iVar1;
  uint64_t uVar2;
  LSTMParams *pLVar3;
  uint64_t uVar4;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,
             &(other->activationsforwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,
             &(other->activationsbackwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weightparams_).super_RepeatedPtrFieldBase,
             &(other->weightparams_).super_RepeatedPtrFieldBase);
  pLVar3 = this->params_;
  uVar2 = this->inputvectorsize_;
  uVar4 = other->inputvectorsize_;
  this->params_ = other->params_;
  this->inputvectorsize_ = uVar4;
  other->params_ = pLVar3;
  other->inputvectorsize_ = uVar2;
  uVar2 = this->outputvectorsize_;
  this->outputvectorsize_ = other->outputvectorsize_;
  other->outputvectorsize_ = uVar2;
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::InternalSwap(BiDirectionalLSTMLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  activationsforwardlstm_.InternalSwap(&other->activationsforwardlstm_);
  activationsbackwardlstm_.InternalSwap(&other->activationsbackwardlstm_);
  weightparams_.InternalSwap(&other->weightparams_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(BiDirectionalLSTMLayerParams, outputvectorsize_)
      + sizeof(BiDirectionalLSTMLayerParams::outputvectorsize_)
      - PROTOBUF_FIELD_OFFSET(BiDirectionalLSTMLayerParams, params_)>(
          reinterpret_cast<char*>(&params_),
          reinterpret_cast<char*>(&other->params_));
}